

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

bool __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::find_atomic_impl_(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                    *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                   int *val)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  HME entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
  local_58;
  ulong uStack_40;
  
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this->field_0x18,key);
  local_58.ptr.rank = 0;
  local_58.ptr.ptr = 0;
  local_58.len = 0;
  uStack_40 = (ulong)(uint)uStack_40;
  bVar4 = false;
  uVar3 = 0;
  while( true ) {
    atomic_get_entry((HME *)&local_78,this,(uVar3 * uVar3 + sVar2) % this->capacity_);
    local_58.len = local_78.field_2._M_allocated_capacity;
    uStack_40 = local_78.field_2._8_8_;
    local_58.ptr.rank = (size_t)local_78._M_dataplus._M_p;
    local_58.ptr.ptr = local_78._M_string_length;
    if ((local_78.field_2._8_8_ & 0x200000000) != 0) {
      Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_void>
      ::get(&local_78,&local_58);
      if (local_78._M_string_length == key->_M_string_length) {
        if (local_78._M_string_length == 0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp(local_78._M_dataplus._M_p,(key->_M_dataplus)._M_p,local_78._M_string_length);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4) break;
    uVar3 = uVar3 + 1;
    if (this->capacity_ <= uVar3) {
      return bVar4;
    }
  }
  *val = (uint)uStack_40;
  return bVar4;
}

Assistant:

bool find_atomic_impl_(const Key &key, T &val) {
    size_t hash = hash_fn_(key);
    size_type probe = 0;
    bool success = false;
    HME entry;
    int status;
    do {
      size_type slot = (hash + get_probe(probe++)) % capacity();
      entry = atomic_get_entry(slot);
      status = entry.used;
      if (status & ready_flag) {
        success = (entry.get_key() == key);
      }
    } while (!success && !(status & free_flag) && probe < capacity());
    if (success) {
      val = entry.get_val();
      return true;
    } else {
      return false;
    }
  }